

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack11_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x7ff;
  out[1] = uVar1 >> 0xb & 0x7ff;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x16;
  out[2] = uVar1 >> 0x16 | (uVar2 & 1) << 10;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1f70);
  auVar4._8_4_ = 0x7ff;
  auVar4._0_8_ = 0x7ff000007ff;
  auVar4._12_4_ = 0x7ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 3) = auVar3._0_8_;
  out[5] = uVar2 >> 0x17;
  uVar1 = in[2];
  out[5] = uVar2 >> 0x17 | (uVar1 & 3) << 9;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1f80);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 6) = auVar3._0_8_;
  uVar2 = in[3];
  out[8] = uVar1 >> 0x18;
  out[8] = uVar1 >> 0x18 | (uVar2 & 7) << 8;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1f90);
  auVar3 = vpand_avx(auVar3,auVar4);
  uVar1 = in[4];
  *(long *)(out + 9) = auVar3._0_8_;
  out[0xb] = uVar2 >> 0x19;
  out[0xb] = uVar2 >> 0x19 | (uVar1 & 0xf) << 7;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1fa0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0xc) = auVar3._0_8_;
  out[0xe] = uVar1 >> 0x1a;
  uVar2 = in[5];
  out[0xe] = uVar1 >> 0x1a | (uVar2 & 0x1f) << 6;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1fb0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0xf) = auVar3._0_8_;
  uVar1 = in[6];
  out[0x11] = uVar2 >> 0x1b;
  out[0x11] = uVar2 >> 0x1b | (uVar1 & 0x3f) << 5;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1fc0);
  auVar3 = vpand_avx(auVar3,auVar4);
  uVar2 = in[7];
  *(long *)(out + 0x12) = auVar3._0_8_;
  out[0x14] = uVar1 >> 0x1c;
  out[0x14] = uVar1 >> 0x1c | (uVar2 & 0x7f) << 4;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1fd0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x15) = auVar3._0_8_;
  out[0x17] = uVar2 >> 0x1d;
  uVar1 = in[8];
  out[0x17] = uVar2 >> 0x1d | (uVar1 & 0xff) << 3;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1fe0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x18) = auVar3._0_8_;
  uVar2 = in[9];
  out[0x1a] = uVar1 >> 0x1e;
  out[0x1a] = uVar1 >> 0x1e | (uVar2 & 0x1ff) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a1ff0);
  auVar3 = vpand_avx(auVar3,auVar4);
  uVar1 = in[10];
  *(long *)(out + 0x1b) = auVar3._0_8_;
  out[0x1d] = uVar2 >> 0x1f;
  out[0x1d] = uVar2 >> 0x1f | (uVar1 & 0x3ff) << 1;
  out[0x1e] = uVar1 >> 10 & 0x7ff;
  out[0x1f] = uVar1 >> 0x15;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack11_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 11);
  out++;
  *out = ((*in) >> 11) % (1U << 11);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 1)) << (11 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 11);
  out++;
  *out = ((*in) >> 12) % (1U << 11);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 2)) << (11 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 11);
  out++;
  *out = ((*in) >> 13) % (1U << 11);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 3)) << (11 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 11);
  out++;
  *out = ((*in) >> 14) % (1U << 11);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 4)) << (11 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 11);
  out++;
  *out = ((*in) >> 15) % (1U << 11);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 5)) << (11 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 11);
  out++;
  *out = ((*in) >> 16) % (1U << 11);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 6)) << (11 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 11);
  out++;
  *out = ((*in) >> 17) % (1U << 11);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 7)) << (11 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 11);
  out++;
  *out = ((*in) >> 18) % (1U << 11);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 8)) << (11 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 11);
  out++;
  *out = ((*in) >> 19) % (1U << 11);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 9)) << (11 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 11);
  out++;
  *out = ((*in) >> 20) % (1U << 11);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 10)) << (11 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 11);
  out++;
  *out = ((*in) >> 21);
  ++in;
  out++;

  return in;
}